

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_opt.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  StateRecorder *this;
  uint uVar1;
  unsigned_long uVar2;
  pointer puVar3;
  _Manager_type p_Var4;
  bool bVar5;
  int iVar6;
  DatabaseInterface *resolver;
  long lVar7;
  char *__ptr;
  pointer puVar8;
  size_t sStack_270;
  bool optimize_size;
  int local_264;
  size_t hash_count;
  DatabaseInterface *local_258;
  StateReplayer replayer;
  vector<unsigned_char,_std::allocator<unsigned_char>_> state_json;
  size_t state_json_size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  OptimizeReplayer optimize_replayer;
  string output_db_path;
  string input_db_path;
  CLICallbacks cbs;
  CLIParser parser;
  CLICallbacks local_a8;
  
  input_db_path._M_dataplus._M_p = (pointer)&input_db_path.field_2;
  input_db_path._M_string_length = 0;
  output_db_path._M_dataplus._M_p = (pointer)&output_db_path.field_2;
  output_db_path._M_string_length = 0;
  input_db_path.field_2._M_local_buf[0] = '\0';
  output_db_path.field_2._M_local_buf[0] = '\0';
  cbs.callbacks._M_h._M_buckets = &cbs.callbacks._M_h._M_single_bucket;
  cbs.callbacks._M_h._M_bucket_count = 1;
  cbs.callbacks._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  cbs.callbacks._M_h._M_element_count = 0;
  cbs.callbacks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  cbs.callbacks._M_h._M_rehash_policy._M_next_resize = 0;
  cbs.callbacks._M_h._M_single_bucket = (__node_base_ptr)0x0;
  cbs.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  cbs.error_handler.super__Function_base._M_functor._8_8_ = 0;
  cbs.error_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  cbs.error_handler._M_invoker = (_Invoker_type)0x0;
  cbs.default_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  cbs.default_handler.super__Function_base._M_functor._8_8_ = 0;
  cbs.default_handler.super__Function_base._M_manager = (_Manager_type)0x0;
  cbs.default_handler._M_invoker = (_Invoker_type)0x0;
  optimize_size = false;
  parser.cbs.callbacks._M_h._M_buckets = (__buckets_ptr)0x0;
  parser.cbs.callbacks._M_h._M_bucket_count = 0;
  parser.cbs.callbacks._M_h._M_element_count =
       (size_type)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:136:20)>
       ::_M_invoke;
  parser.cbs.callbacks._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:136:20)>
       ::_M_manager;
  Fossilize::CLICallbacks::add(&cbs,"--help",(function<void_(Fossilize::CLIParser_&)> *)&parser);
  if (parser.cbs.callbacks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)parser.cbs.callbacks._M_h._M_before_begin._M_nxt)(&parser,&parser,3);
  }
  parser.cbs.callbacks._M_h._M_bucket_count = 0;
  parser.cbs.callbacks._M_h._M_buckets = (__buckets_ptr)&input_db_path;
  parser.cbs.callbacks._M_h._M_element_count =
       (size_type)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:137:24)>
       ::_M_invoke;
  parser.cbs.callbacks._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:137:24)>
       ::_M_manager;
  Fossilize::CLICallbacks::add(&cbs,"--input-db",(function<void_(Fossilize::CLIParser_&)> *)&parser)
  ;
  if (parser.cbs.callbacks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)parser.cbs.callbacks._M_h._M_before_begin._M_nxt)(&parser,&parser,3);
  }
  parser.cbs.callbacks._M_h._M_bucket_count = 0;
  parser.cbs.callbacks._M_h._M_buckets = (__buckets_ptr)&output_db_path;
  parser.cbs.callbacks._M_h._M_element_count =
       (size_type)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:138:25)>
       ::_M_invoke;
  parser.cbs.callbacks._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:138:25)>
       ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--output-db",(function<void_(Fossilize::CLIParser_&)> *)&parser);
  if (parser.cbs.callbacks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)parser.cbs.callbacks._M_h._M_before_begin._M_nxt)(&parser,&parser,3);
  }
  parser.cbs.callbacks._M_h._M_bucket_count = 0;
  parser.cbs.callbacks._M_h._M_buckets = (__buckets_ptr)&optimize_size;
  parser.cbs.callbacks._M_h._M_element_count =
       (size_type)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:139:29)>
       ::_M_invoke;
  parser.cbs.callbacks._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)
       std::
       _Function_handler<void_(Fossilize::CLIParser_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:139:29)>
       ::_M_manager;
  Fossilize::CLICallbacks::add
            (&cbs,"--optimize-size",(function<void_(Fossilize::CLIParser_&)> *)&parser);
  if (parser.cbs.callbacks._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    (*(code *)parser.cbs.callbacks._M_h._M_before_begin._M_nxt)(&parser,&parser,3);
  }
  p_Var4 = cbs.error_handler.super__Function_base._M_manager;
  parser.cbs.callbacks._M_h._M_buckets =
       (__buckets_ptr)cbs.error_handler.super__Function_base._M_functor._M_unused._0_8_;
  parser.cbs.callbacks._M_h._M_bucket_count =
       cbs.error_handler.super__Function_base._M_functor._8_8_;
  cbs.error_handler.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  cbs.error_handler.super__Function_base._M_functor._8_8_ = 0;
  parser.cbs.callbacks._M_h._M_before_begin._M_nxt =
       (_Hash_node_base *)cbs.error_handler.super__Function_base._M_manager;
  cbs.error_handler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:140:22)>
       ::_M_manager;
  parser.cbs.callbacks._M_h._M_element_count = (size_type)cbs.error_handler._M_invoker;
  cbs.error_handler._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/fossilize_opt.cpp:140:22)>
       ::_M_invoke;
  if (p_Var4 != (_Manager_type)0x0) {
    (*p_Var4)((_Any_data *)&parser,(_Any_data *)&parser,__destroy_functor);
  }
  Fossilize::CLICallbacks::CLICallbacks(&local_a8,&cbs);
  Fossilize::CLIParser::CLIParser(&parser,&local_a8,argc + -1,argv + 1);
  Fossilize::CLICallbacks::~CLICallbacks(&local_a8);
  bVar5 = Fossilize::CLIParser::parse(&parser);
  if (bVar5) {
    iVar6 = 0;
    if (parser.ended_state != false) goto LAB_0013c4c5;
    if (input_db_path._M_string_length == 0) {
      __ptr = "Fossilize ERROR: No input database provided.\n";
      sStack_270 = 0x2d;
    }
    else {
      if (output_db_path._M_string_length != 0) {
        resolver = Fossilize::create_database(input_db_path._M_dataplus._M_p,ReadOnly);
        local_258 = Fossilize::create_database(output_db_path._M_dataplus._M_p,OverWrite);
        OptimizeReplayer::OptimizeReplayer(&optimize_replayer);
        optimize_replayer.optimize_size = optimize_size;
        Fossilize::StateReplayer::StateReplayer(&replayer);
        this = &optimize_replayer.recorder;
        Fossilize::StateRecorder::set_database_enable_checksum(this,true);
        Fossilize::StateRecorder::set_database_enable_compression(this,true);
        if ((resolver == (DatabaseInterface *)0x0) ||
           (iVar6 = (*resolver->_vptr_DatabaseInterface[2])(resolver), (char)iVar6 == '\0')) {
          fprintf(_stderr,"Fossilize ERROR: Failed to load database: %s\n",argv[1]);
LAB_0013c450:
          fflush(_stderr);
          iVar6 = 1;
        }
        else {
          if (local_258 == (DatabaseInterface *)0x0) {
            fprintf(_stderr,"Fossilize ERROR: Failed to open database for writing: %s\n",argv[2]);
            goto LAB_0013c450;
          }
          Fossilize::StateRecorder::init_recording_thread(this,local_258);
          state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          lVar7 = 0;
          local_264 = 0;
          do {
            if (lVar7 == 0x1c) break;
            hash_count = 0;
            uVar1 = *(uint *)((long)main::playback_order + lVar7);
            iVar6 = (*resolver->_vptr_DatabaseInterface[6])(resolver,(ulong)uVar1,&hash_count,0);
            if ((char)iVar6 == '\0') {
              fwrite("Fossilize ERROR: Failed to get hashes.\n",0x27,1,_stderr);
              fflush(_stderr);
              local_264 = 1;
              break;
            }
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                      (&hashes,hash_count,(allocator_type *)&state_json_size);
            iVar6 = (*resolver->_vptr_DatabaseInterface[6])
                              (resolver,(ulong)uVar1,&hash_count,
                               hashes.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start);
            puVar3 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
            puVar8 = hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if ((char)iVar6 == '\0') {
              fwrite("Fossilize ERROR: Failed to get shader module hashes.\n",0x35,1,_stderr);
              fflush(_stderr);
              bVar5 = false;
              local_264 = 1;
            }
            else {
              for (; puVar8 != puVar3; puVar8 = puVar8 + 1) {
                uVar2 = *puVar8;
                iVar6 = (*resolver->_vptr_DatabaseInterface[3])
                                  (resolver,(ulong)uVar1,uVar2,(allocator_type *)&state_json_size,0,
                                   0);
                if ((char)iVar6 == '\0') {
LAB_0013c36e:
                  fwrite("Fossilize ERROR: Failed to load blob from cache.\n",0x31,1,_stderr);
                  fflush(_stderr);
                  bVar5 = false;
                  local_264 = 1;
                  goto LAB_0013c34f;
                }
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                          (&state_json,state_json_size);
                iVar6 = (*resolver->_vptr_DatabaseInterface[3])
                                  (resolver,(ulong)uVar1,uVar2,(allocator_type *)&state_json_size);
                if ((char)iVar6 == '\0') goto LAB_0013c36e;
                bVar5 = Fossilize::StateReplayer::parse
                                  (&replayer,&optimize_replayer.super_StateCreatorInterface,resolver
                                   ,state_json.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                                   (long)state_json.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)state_json.
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
                if (!bVar5) {
                  fprintf(_stderr,"Fossilize ERROR: Failed to parse blob (tag: %d, hash: 0x%lx).\n",
                          (ulong)uVar1,uVar2);
                  fflush(_stderr);
                }
              }
              bVar5 = true;
            }
LAB_0013c34f:
            std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                      (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
            lVar7 = lVar7 + 4;
          } while (bVar5);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&state_json.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
          iVar6 = local_264;
        }
        Fossilize::StateReplayer::~StateReplayer(&replayer);
        OptimizeReplayer::~OptimizeReplayer(&optimize_replayer);
        if (local_258 != (DatabaseInterface *)0x0) {
          (*local_258->_vptr_DatabaseInterface[1])();
        }
        if (resolver != (DatabaseInterface *)0x0) {
          (*resolver->_vptr_DatabaseInterface[1])(resolver);
        }
        goto LAB_0013c4c5;
      }
      __ptr = "Fossilize ERROR: No output database provided.\n";
      sStack_270 = 0x2e;
    }
    fwrite(__ptr,sStack_270,1,_stderr);
    fflush(_stderr);
    print_help();
  }
  iVar6 = 1;
LAB_0013c4c5:
  Fossilize::CLICallbacks::~CLICallbacks(&parser.cbs);
  Fossilize::CLICallbacks::~CLICallbacks(&cbs);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return iVar6;
}

Assistant:

int main(int argc, char *argv[])
{
	string input_db_path;
	string output_db_path;
	CLICallbacks cbs;
	bool optimize_size = false;

	cbs.add("--help", [](CLIParser &parser) { print_help(); parser.end(); });
	cbs.add("--input-db", [&](CLIParser &parser) { input_db_path = parser.next_string(); });
	cbs.add("--output-db", [&](CLIParser &parser) { output_db_path = parser.next_string(); });
	cbs.add("--optimize-size", [&](CLIParser &) { optimize_size = true; });
	cbs.error_handler = [] { print_help(); };

	CLIParser parser(move(cbs), argc - 1, argv + 1);
	if (!parser.parse())
		return EXIT_FAILURE;
	if (parser.is_ended_state())
		return EXIT_SUCCESS;

	if (input_db_path.empty())
	{
		LOGE("No input database provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	if (output_db_path.empty())
	{
		LOGE("No output database provided.\n");
		print_help();
		return EXIT_FAILURE;
	}

	auto input_db = std::unique_ptr<DatabaseInterface>(create_database(input_db_path.c_str(), DatabaseMode::ReadOnly));
	auto output_db = std::unique_ptr<DatabaseInterface>(create_database(output_db_path.c_str(), DatabaseMode::OverWrite));

	OptimizeReplayer optimize_replayer;
	optimize_replayer.optimize_size = optimize_size;

	StateReplayer replayer;
	optimize_replayer.recorder.set_database_enable_checksum(true);
	optimize_replayer.recorder.set_database_enable_compression(true);

	if (!input_db || !input_db->prepare())
	{
		LOGE("Failed to load database: %s\n", argv[1]);
		return EXIT_FAILURE;
	}

	if (!output_db)
	{
		LOGE("Failed to open database for writing: %s\n", argv[2]);
		return EXIT_FAILURE;
	}

	// Recording thread prepares.
	optimize_replayer.recorder.init_recording_thread(output_db.get());

	static const ResourceTag playback_order[] = {
		RESOURCE_SHADER_MODULE,
		RESOURCE_SAMPLER,
		RESOURCE_DESCRIPTOR_SET_LAYOUT,
		RESOURCE_PIPELINE_LAYOUT,
		RESOURCE_RENDER_PASS,
		RESOURCE_GRAPHICS_PIPELINE,
		RESOURCE_COMPUTE_PIPELINE,
	};

	vector<uint8_t> state_json;
	for (auto &tag : playback_order)
	{
		size_t hash_count = 0;
		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, nullptr))
		{
			LOGE("Failed to get hashes.\n");
			return EXIT_FAILURE;
		}

		vector<Hash> hashes(hash_count);

		if (!input_db->get_hash_list_for_resource_tag(tag, &hash_count, hashes.data()))
		{
			LOGE("Failed to get shader module hashes.\n");
			return EXIT_FAILURE;
		}

		for (auto hash : hashes)
		{
			size_t state_json_size;
			if (!input_db->read_entry(tag, hash, &state_json_size, nullptr, 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			state_json.resize(state_json_size);

			if (!input_db->read_entry(tag, hash, &state_json_size, state_json.data(), 0))
			{
				LOGE("Failed to load blob from cache.\n");
				return EXIT_FAILURE;
			}

			if (!replayer.parse(optimize_replayer, input_db.get(), state_json.data(), state_json.size()))
				LOGE("Failed to parse blob (tag: %d, hash: 0x%" PRIx64 ").\n", tag, hash);
		}
	}
}